

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O0

int tcv_write(tcv_t *tcv,uint8_t devaddr,uint8_t regaddr,uint8_t *data,size_t len)

{
  _Bool _Var1;
  int local_34;
  int ret;
  size_t len_local;
  uint8_t *data_local;
  uint8_t regaddr_local;
  uint8_t devaddr_local;
  tcv_t *tcv_local;
  
  local_34 = -0xd;
  _Var1 = tcv_check_and_lock_ok(tcv);
  if ((_Var1) && (data != (uint8_t *)0x0)) {
    _Var1 = tcv_is_initialized(tcv);
    if (_Var1) {
      local_34 = (*tcv->fun->raw_write)(tcv,devaddr,regaddr,data,len);
    }
    tcv_unlock(tcv);
    tcv_local._4_4_ = local_34;
  }
  else {
    tcv_local._4_4_ = -4;
  }
  return tcv_local._4_4_;
}

Assistant:

int tcv_write(tcv_t *tcv, uint8_t devaddr, uint8_t regaddr, const uint8_t* data, size_t len)
{
	int ret = TCV_ERR_NOT_INITIALIZED;

	if (!tcv_check_and_lock_ok(tcv) || !data)
		return TCV_ERR_INVALID_ARG;

	if (tcv_is_initialized(tcv)) {
		ret = tcv->fun->raw_write(tcv, devaddr, regaddr, data, len);
	}

	tcv_unlock(tcv);
	return ret;
}